

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O1

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoPrism>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoPrism> *this,TPZGeoElRefLess<pzgeom::TPZGeoPrism> *gel)

{
  int64_t iVar1;
  int64_t iVar2;
  int64_t iVar3;
  int64_t iVar4;
  int64_t iVar5;
  long lVar6;
  TPZGeoElSide gelside;
  TPZGeoElSide thisside;
  TPZGeoElSide local_60;
  TPZGeoElSide local_48;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018ad9d0;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_018ad628,&gel->super_TPZGeoEl);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_018ad328;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.super_TPZPrism.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZNodeRep_018b4f48;
  iVar1 = (gel->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[1];
  iVar2 = (gel->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[2];
  iVar3 = (gel->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[3];
  iVar4 = (gel->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[4];
  iVar5 = (gel->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[5];
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[0] =
       (gel->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[0];
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[1] = iVar1;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[2] = iVar2;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[3] = iVar3;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[4] = iVar4;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes[5] = iVar5;
  (this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.super_TPZPrism.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZGeoPrism_018b4ec0;
  lVar6 = 0x88;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + lVar6 + -0x58) =
         &PTR__TPZGeoElSideIndex_018a3510;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + lVar6 + -0x48) =
         0xffffffff;
    *(undefined8 *)
     ((long)(this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes + lVar6 + -0x50) =
         0xffffffffffffffff;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x280);
  lVar6 = 0x78;
  do {
    TPZGeoElSide::TPZGeoElSide
              (&local_48,
               (TPZGeoElSideIndex *)
               ((long)(this->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
               lVar6 + -0x48),(this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::TPZGeoElSide
              (&local_60,
               (TPZGeoElSideIndex *)
               ((long)(gel->fGeo).super_TPZNodeRep<6,_pztopology::TPZPrism>.fNodeIndexes +
               lVar6 + -0x48),(this->super_TPZGeoEl).fMesh);
    TPZGeoElSide::SetConnectivity(&local_48,&local_60);
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x270);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(const TPZGeoElRefLess<TGeo>  &gel)
:TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(gel), fGeo(gel.fGeo){
	int i;
	for(i=0;i<TGeo::NSides;i++){
		TPZGeoElSide thisside(this->fNeighbours[i], this->Mesh());
		TPZGeoElSide gelside(gel.fNeighbours[i], this->Mesh());
		thisside.SetConnectivity(gelside);
		//     fNeighbours[i].SetConnectivity(gel.fNeighbours[i]);
	}
	//  fSubElement = -1;
}